

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp.hpp
# Opt level: O3

void duckdb::alp::AlpCompression<float,_false>::FindBestFactorAndExponent
               (float *input_vector,idx_t n_values,State *state)

{
  pointer pAVar1;
  double dVar2;
  AlpEncodingIndices AVar3;
  uint64_t uVar4;
  ulong uVar5;
  long lVar6;
  AlpEncodingIndices AVar7;
  ulong uVar8;
  ushort uVar9;
  uint64_t uVar10;
  AlpCombination *combination;
  pointer pAVar11;
  undefined1 auVar12 [16];
  vector<float,_true> vector_sample;
  vector<float,_true> local_58;
  State *local_38;
  
  local_58.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_58.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (float *)0x0;
  local_58.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  local_38 = state;
  if (n_values != 0) {
    auVar12._8_4_ = (int)(n_values >> 0x20);
    auVar12._0_8_ = n_values;
    auVar12._12_4_ = 0x45300000;
    dVar2 = ceil(((auVar12._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)n_values) - 4503599627370496.0)) * 0.03125);
    uVar5 = 1;
    if (1 < (uint)(long)dVar2) {
      uVar5 = (long)dVar2 & 0xffffffff;
    }
    uVar8 = 0;
    do {
      if (local_58.super_vector<float,_std::allocator<float>_>.
          super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_58.super_vector<float,_std::allocator<float>_>.
          super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        ::std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)&local_58,
                   (iterator)
                   local_58.super_vector<float,_std::allocator<float>_>.
                   super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
                   ._M_finish,input_vector);
      }
      else {
        *local_58.super_vector<float,_std::allocator<float>_>.
         super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
             = *input_vector;
        local_58.super_vector<float,_std::allocator<float>_>.
        super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
             = local_58.super_vector<float,_std::allocator<float>_>.
               super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
               _M_finish + 1;
      }
      uVar8 = uVar8 + uVar5;
      input_vector = input_vector + uVar5;
    } while (uVar8 < n_values);
  }
  pAVar11 = (local_38->best_k_combinations).
            super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
            super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pAVar1 = (local_38->best_k_combinations).
           super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
           super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pAVar11 == pAVar1) {
    AVar3.exponent = '\0';
    AVar3.factor = '\0';
  }
  else {
    uVar10 = 0xffffffffffffffff;
    lVar6 = 0;
    uVar9 = 0;
    AVar7.exponent = '\0';
    AVar7.factor = '\0';
    do {
      uVar4 = DryCompressToEstimateSize<false>(&local_58,SUB42(*(undefined4 *)pAVar11,0));
      if (uVar4 < uVar10) {
        AVar7 = pAVar11->encoding_indices;
        uVar9 = (ushort)AVar7 >> 8;
        lVar6 = 0;
        uVar10 = uVar4;
      }
      else {
        lVar6 = lVar6 + 1;
        if (lVar6 == 2) break;
      }
      pAVar11 = pAVar11 + 1;
    } while (pAVar11 != pAVar1);
    AVar3 = (AlpEncodingIndices)((ushort)AVar7 & 0xff | uVar9 << 8);
  }
  local_38->vector_encoding_indices = AVar3;
  if (local_58.super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_58.super_vector<float,_std::allocator<float>_>.
                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void FindBestFactorAndExponent(const T *input_vector, idx_t n_values, State &state) {
		//! We sample equidistant values within a vector; to do this we skip a fixed number of values
		vector<T> vector_sample;
		auto idx_increments = MaxValue<uint32_t>(
		    1, ExactNumericCast<uint32_t>(std::ceil((double)n_values / AlpConstants::SAMPLES_PER_VECTOR)));
		for (idx_t i = 0; i < n_values; i += idx_increments) {
			vector_sample.push_back(input_vector[i]);
		}

		AlpEncodingIndices best_encoding_indices = {0, 0};
		uint64_t best_total_bits = NumericLimits<uint64_t>::Maximum();
		idx_t worse_total_bits_counter = 0;

		//! We try each K combination in search for the one which minimize the compression size in the vector
		for (auto &combination : state.best_k_combinations) {
			uint64_t estimated_compression_size =
			    DryCompressToEstimateSize<false>(vector_sample, combination.encoding_indices);

			// If current compression size is worse (higher) or equal than the current best combination
			if (estimated_compression_size >= best_total_bits) {
				worse_total_bits_counter += 1;
				// Early exit strategy
				if (worse_total_bits_counter == AlpConstants::SAMPLING_EARLY_EXIT_THRESHOLD) {
					break;
				}
				continue;
			}
			// Otherwise we replace the best and continue trying with the next combination
			best_total_bits = estimated_compression_size;
			best_encoding_indices = combination.encoding_indices;
			worse_total_bits_counter = 0;
		}
		state.vector_encoding_indices = best_encoding_indices;
	}